

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::GeneratorsForTest::moveNext(GeneratorsForTest *this)

{
  pointer ppIVar1;
  pointer ppIVar2;
  int iVar3;
  pointer ppIVar4;
  
  ppIVar1 = (this->m_generatorsInOrder).
            super__Vector_base<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppIVar2 = (this->m_generatorsInOrder).
            super__Vector_base<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    ppIVar4 = ppIVar2;
    if (ppIVar4 == ppIVar1) break;
    iVar3 = (*(*ppIVar4)->_vptr_IGeneratorInfo[2])();
    ppIVar2 = ppIVar4 + 1;
  } while ((char)iVar3 == '\0');
  return ppIVar4 != ppIVar1;
}

Assistant:

Generic::AnyOf<ExpressionT> Matcher<ExpressionT>::operator || ( Matcher<ExpressionT> const& other ) const {
        Generic::AnyOf<ExpressionT> anyOfExpr;
        anyOfExpr.add( *this );
        anyOfExpr.add( other );
        return anyOfExpr;
    }